

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_tests.cpp
# Opt level: O3

void __thiscall rpc_tests::rpc_parse_monetary_values::test_method(rpc_parse_monetary_values *this)

{
  iterator in_R8;
  iterator pvVar1;
  iterator in_R9;
  iterator pvVar2;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  const_string file_29;
  const_string file_30;
  const_string file_31;
  const_string file_32;
  const_string file_33;
  const_string file_34;
  const_string file_35;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  const_string msg_31;
  const_string msg_32;
  const_string msg_33;
  const_string msg_34;
  const_string msg_35;
  check_type cVar3;
  char *local_828;
  char *local_820;
  undefined1 *local_818;
  undefined1 *local_810;
  char *local_808;
  char *local_800;
  undefined1 *local_7f8;
  undefined1 *local_7f0;
  char *local_7e8;
  char *local_7e0;
  char *local_7a8;
  char *local_7a0;
  undefined1 *local_798;
  undefined1 *local_790;
  char *local_788;
  char *local_780;
  undefined1 *local_778;
  undefined1 *local_770;
  char *local_768;
  char *local_760;
  char *local_728;
  char *local_720;
  undefined1 *local_718;
  undefined1 *local_710;
  char *local_708;
  char *local_700;
  undefined1 *local_6f8;
  undefined1 *local_6f0;
  char *local_6e8;
  char *local_6e0;
  char *local_6a8;
  char *local_6a0;
  undefined1 *local_698;
  undefined1 *local_690;
  char *local_688;
  char *local_680;
  undefined1 *local_678;
  undefined1 *local_670;
  char *local_668;
  char *local_660;
  char *local_628;
  char *local_620;
  undefined1 *local_618;
  undefined1 *local_610;
  char *local_608;
  char *local_600;
  undefined1 *local_5f8;
  undefined1 *local_5f0;
  char *local_5e8;
  char *local_5e0;
  undefined1 *local_5d8;
  undefined1 *local_5d0;
  char *local_5c8;
  char *local_5c0;
  char *local_588;
  char *local_580;
  undefined1 *local_578;
  undefined1 *local_570;
  char *local_568;
  char *local_560;
  undefined1 *local_558;
  undefined1 *local_550;
  char *local_548;
  char *local_540;
  undefined1 *local_538;
  undefined1 *local_530;
  char *local_528;
  char *local_520;
  char *local_4e8;
  char *local_4e0;
  undefined1 *local_4d8;
  undefined1 *local_4d0;
  char *local_4c8;
  char *local_4c0;
  undefined1 *local_4b8;
  undefined1 *local_4b0;
  char *local_4a8;
  char *local_4a0;
  char *local_468;
  char *local_460;
  undefined1 *local_458;
  undefined1 *local_450;
  char *local_448;
  char *local_440;
  undefined1 *local_438;
  undefined1 *local_430;
  char *local_428;
  char *local_420;
  undefined1 *local_418;
  undefined1 *local_410;
  char *local_408;
  char *local_400;
  undefined1 *local_3f8;
  undefined1 *local_3f0;
  char *local_3e8;
  char *local_3e0;
  undefined1 *local_3d8;
  undefined1 *local_3d0;
  char *local_3c8;
  char *local_3c0;
  undefined1 *local_3b8;
  undefined1 *local_3b0;
  char *local_3a8;
  char *local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  char *local_388;
  char *local_380;
  undefined1 *local_378;
  undefined1 *local_370;
  char *local_368;
  char *local_360;
  undefined1 *local_358;
  undefined1 *local_350;
  char *local_348;
  char *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  char *local_328;
  char *local_320;
  undefined1 *local_318;
  undefined1 *local_310;
  char *local_308;
  char *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  char *local_2e8;
  char *local_2e0;
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  char *local_2c8;
  char *local_2c0;
  undefined1 *local_2b8;
  undefined1 *local_2b0;
  char *local_2a8;
  char *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  char *local_288;
  char *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  char *local_268;
  char *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  char *local_248;
  char *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  char *local_228;
  char *local_220;
  undefined8 local_218;
  CAmount local_210;
  lazy_ostream local_208;
  undefined1 *local_1f8;
  char *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_198;
  char *local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  char *local_178;
  char *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  char *local_158;
  char *local_150;
  undefined8 *local_148;
  undefined **local_140;
  undefined1 local_138;
  undefined1 *local_130;
  undefined8 **local_128;
  CAmount *local_120;
  char *local_118;
  char *local_110;
  assertion_result local_108 [2];
  rpc_tests *local_d0;
  string *local_c8;
  long local_c0 [2];
  undefined1 local_b0 [8];
  bool local_a8;
  undefined7 uStack_a7;
  undefined1 *local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  vector<UniValue,_std::allocator<UniValue>_> local_70;
  undefined1 local_58 [16];
  shared_count sStack_48;
  CAmount **local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_158 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_150 = "";
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x119;
  file.m_begin = (iterator)&local_158;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_168,msg);
  local_58._0_8_ = (rpc_tests *)&sStack_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"-0.00000001","");
  ValueFromString((UniValue *)local_b0,(rpc_tests *)local_58._0_8_,(string *)local_58._8_8_);
  AmountFromValue((UniValue *)local_b0,8);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(uStack_a7,local_a8) != &local_98) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(uStack_a7,local_a8),local_98._M_allocated_capacity + 1);
  }
  if ((rpc_tests *)local_58._0_8_ != (rpc_tests *)&sStack_48) {
    operator_delete((void *)local_58._0_8_,
                    (ulong)((long)&(sStack_48.pi_)->_vptr_sp_counted_base + 1));
  }
  local_178 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_170 = "";
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar3 = 0x564c69;
  file_00.m_end = (iterator)0x119;
  file_00.m_begin = (iterator)&local_178;
  msg_00.m_end = in_R9;
  msg_00.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_188,
             msg_00);
  local_58._0_8_ = local_58._0_8_ & 0xffffffffffffff00;
  local_58._8_8_ = (element_type *)0x0;
  sStack_48.pi_ = (sp_counted_base *)0x0;
  local_a8 = false;
  local_b0 = (undefined1  [8])&PTR__lazy_ostream_013af210;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_98._M_allocated_capacity = 0xec5be1;
  local_198 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_190 = "";
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)local_b0,1,1,WARN,_cVar3,
             (size_t)&local_198,0x119);
  boost::detail::shared_count::~shared_count(&sStack_48);
  local_1d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1d0 = "";
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x11a;
  file_01.m_begin = (iterator)&local_1d8;
  msg_01.m_end = pvVar2;
  msg_01.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1e8,
             msg_01);
  local_208.m_empty = false;
  local_208._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_1f8 = boost::unit_test::lazy_ostream::inst;
  local_1f0 = "";
  local_d0 = (rpc_tests *)local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"0","");
  ValueFromString((UniValue *)local_b0,local_d0,local_c8);
  local_210 = AmountFromValue((UniValue *)local_b0,8);
  local_120 = &local_210;
  local_108[0].p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_210 == 0);
  local_148 = &local_218;
  local_218 = 0;
  local_108[0].m_message.px = (element_type *)0x0;
  local_108[0].m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_118 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_110 = "";
  local_40 = &local_120;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae428;
  sStack_48.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_128 = &local_148;
  local_138 = 0;
  local_140 = &PTR__lazy_ostream_013ae958;
  local_130 = boost::unit_test::lazy_ostream::inst;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (local_108,&local_208,1,2,REQUIRE,0xec80f3,(size_t)&local_118,0x11a,local_58,"0LL",
             &local_140);
  boost::detail::shared_count::~shared_count(&local_108[0].m_message.pn);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(uStack_a7,local_a8) != &local_98) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(uStack_a7,local_a8),(ulong)(local_98._M_allocated_capacity + 1));
  }
  if (local_d0 != (rpc_tests *)local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  local_228 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_220 = "";
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x11b;
  file_02.m_begin = (iterator)&local_228;
  msg_02.m_end = pvVar2;
  msg_02.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_238,
             msg_02);
  local_208.m_empty = false;
  local_208._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_1f8 = boost::unit_test::lazy_ostream::inst;
  local_1f0 = "";
  local_d0 = (rpc_tests *)local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"0.00000000","");
  ValueFromString((UniValue *)local_b0,local_d0,local_c8);
  local_210 = AmountFromValue((UniValue *)local_b0,8);
  local_218 = 0;
  local_108[0].p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_210 == 0);
  local_108[0].m_message.px = (element_type *)0x0;
  local_108[0].m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_118 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_110 = "";
  local_120 = &local_210;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae428;
  sStack_48.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_40 = &local_120;
  local_148 = &local_218;
  local_138 = 0;
  local_140 = &PTR__lazy_ostream_013ae958;
  local_130 = boost::unit_test::lazy_ostream::inst;
  local_128 = &local_148;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (local_108,&local_208,1,2,REQUIRE,0xec8119,(size_t)&local_118,0x11b,local_58,"0LL",
             &local_140);
  boost::detail::shared_count::~shared_count(&local_108[0].m_message.pn);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(uStack_a7,local_a8) != &local_98) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(uStack_a7,local_a8),(ulong)(local_98._M_allocated_capacity + 1));
  }
  if (local_d0 != (rpc_tests *)local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  local_248 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_240 = "";
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x11c;
  file_03.m_begin = (iterator)&local_248;
  msg_03.m_end = pvVar2;
  msg_03.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_258,
             msg_03);
  local_208.m_empty = false;
  local_208._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_1f8 = boost::unit_test::lazy_ostream::inst;
  local_1f0 = "";
  local_d0 = (rpc_tests *)local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"0.00000001","");
  ValueFromString((UniValue *)local_b0,local_d0,local_c8);
  local_210 = AmountFromValue((UniValue *)local_b0,8);
  local_218 = 1;
  local_108[0].p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_210 == 1);
  local_108[0].m_message.px = (element_type *)0x0;
  local_108[0].m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_118 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_110 = "";
  local_120 = &local_210;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae428;
  sStack_48.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_40 = &local_120;
  local_148 = &local_218;
  local_138 = 0;
  local_140 = &PTR__lazy_ostream_013ae958;
  local_130 = boost::unit_test::lazy_ostream::inst;
  local_128 = &local_148;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (local_108,&local_208,1,2,REQUIRE,0xec8148,(size_t)&local_118,0x11c,local_58,"1LL",
             &local_140);
  boost::detail::shared_count::~shared_count(&local_108[0].m_message.pn);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(uStack_a7,local_a8) != &local_98) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(uStack_a7,local_a8),(ulong)(local_98._M_allocated_capacity + 1));
  }
  if (local_d0 != (rpc_tests *)local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  local_268 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_260 = "";
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x11d;
  file_04.m_begin = (iterator)&local_268;
  msg_04.m_end = pvVar2;
  msg_04.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_278,
             msg_04);
  local_208.m_empty = false;
  local_208._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_1f8 = boost::unit_test::lazy_ostream::inst;
  local_1f0 = "";
  local_d0 = (rpc_tests *)local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"0.17622195","");
  ValueFromString((UniValue *)local_b0,local_d0,local_c8);
  local_210 = AmountFromValue((UniValue *)local_b0,8);
  local_218 = 0x10ce4b3;
  local_108[0].p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_210 == 0x10ce4b3);
  local_108[0].m_message.px = (element_type *)0x0;
  local_108[0].m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_118 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_110 = "";
  local_120 = &local_210;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae428;
  sStack_48.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_40 = &local_120;
  local_148 = &local_218;
  local_138 = 0;
  local_140 = &PTR__lazy_ostream_013ae958;
  local_130 = boost::unit_test::lazy_ostream::inst;
  local_128 = &local_148;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (local_108,&local_208,1,2,REQUIRE,0xec8177,(size_t)&local_118,0x11d,local_58,
             "17622195LL",&local_140);
  boost::detail::shared_count::~shared_count(&local_108[0].m_message.pn);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(uStack_a7,local_a8) != &local_98) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(uStack_a7,local_a8),(ulong)(local_98._M_allocated_capacity + 1));
  }
  if (local_d0 != (rpc_tests *)local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_280 = "";
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x11e;
  file_05.m_begin = (iterator)&local_288;
  msg_05.m_end = pvVar2;
  msg_05.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_298,
             msg_05);
  local_208.m_empty = false;
  local_208._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_1f8 = boost::unit_test::lazy_ostream::inst;
  local_1f0 = "";
  local_d0 = (rpc_tests *)local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"0.5","");
  ValueFromString((UniValue *)local_b0,local_d0,local_c8);
  local_210 = AmountFromValue((UniValue *)local_b0,8);
  local_218 = 50000000;
  local_108[0].p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_210 == 50000000);
  local_108[0].m_message.px = (element_type *)0x0;
  local_108[0].m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_118 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_110 = "";
  local_120 = &local_210;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae428;
  sStack_48.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_40 = &local_120;
  local_148 = &local_218;
  local_138 = 0;
  local_140 = &PTR__lazy_ostream_013ae958;
  local_130 = boost::unit_test::lazy_ostream::inst;
  local_128 = &local_148;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (local_108,&local_208,1,2,REQUIRE,0xec81b1,(size_t)&local_118,0x11e,local_58,
             "50000000LL",&local_140);
  boost::detail::shared_count::~shared_count(&local_108[0].m_message.pn);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(uStack_a7,local_a8) != &local_98) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(uStack_a7,local_a8),(ulong)(local_98._M_allocated_capacity + 1));
  }
  if (local_d0 != (rpc_tests *)local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  local_2a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_2a0 = "";
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x11f;
  file_06.m_begin = (iterator)&local_2a8;
  msg_06.m_end = pvVar2;
  msg_06.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_2b8,
             msg_06);
  local_208.m_empty = false;
  local_208._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_1f8 = boost::unit_test::lazy_ostream::inst;
  local_1f0 = "";
  local_d0 = (rpc_tests *)local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"0.50000000","");
  ValueFromString((UniValue *)local_b0,local_d0,local_c8);
  local_210 = AmountFromValue((UniValue *)local_b0,8);
  local_218 = 50000000;
  local_108[0].p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_210 == 50000000);
  local_108[0].m_message.px = (element_type *)0x0;
  local_108[0].m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_118 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_110 = "";
  local_120 = &local_210;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae428;
  sStack_48.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_40 = &local_120;
  local_148 = &local_218;
  local_138 = 0;
  local_140 = &PTR__lazy_ostream_013ae958;
  local_130 = boost::unit_test::lazy_ostream::inst;
  local_128 = &local_148;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (local_108,&local_208,1,2,REQUIRE,0xec81e4,(size_t)&local_118,0x11f,local_58,
             "50000000LL",&local_140);
  boost::detail::shared_count::~shared_count(&local_108[0].m_message.pn);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(uStack_a7,local_a8) != &local_98) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(uStack_a7,local_a8),(ulong)(local_98._M_allocated_capacity + 1));
  }
  if (local_d0 != (rpc_tests *)local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  local_2c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_2c0 = "";
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x120;
  file_07.m_begin = (iterator)&local_2c8;
  msg_07.m_end = pvVar2;
  msg_07.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_2d8,
             msg_07);
  local_208.m_empty = false;
  local_208._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_1f8 = boost::unit_test::lazy_ostream::inst;
  local_1f0 = "";
  local_d0 = (rpc_tests *)local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"0.89898989","");
  ValueFromString((UniValue *)local_b0,local_d0,local_c8);
  local_210 = AmountFromValue((UniValue *)local_b0,8);
  local_218 = 0x55bbfed;
  local_108[0].p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_210 == 0x55bbfed);
  local_108[0].m_message.px = (element_type *)0x0;
  local_108[0].m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_118 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_110 = "";
  local_120 = &local_210;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae428;
  sStack_48.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_40 = &local_120;
  local_148 = &local_218;
  local_138 = 0;
  local_140 = &PTR__lazy_ostream_013ae958;
  local_130 = boost::unit_test::lazy_ostream::inst;
  local_128 = &local_148;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (local_108,&local_208,1,2,REQUIRE,0xec8213,(size_t)&local_118,0x120,local_58,
             "89898989LL",&local_140);
  boost::detail::shared_count::~shared_count(&local_108[0].m_message.pn);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(uStack_a7,local_a8) != &local_98) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(uStack_a7,local_a8),(ulong)(local_98._M_allocated_capacity + 1));
  }
  if (local_d0 != (rpc_tests *)local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  local_2e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_2e0 = "";
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x121;
  file_08.m_begin = (iterator)&local_2e8;
  msg_08.m_end = pvVar2;
  msg_08.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_2f8,
             msg_08);
  local_208.m_empty = false;
  local_208._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_1f8 = boost::unit_test::lazy_ostream::inst;
  local_1f0 = "";
  local_d0 = (rpc_tests *)local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"1.00000000","");
  ValueFromString((UniValue *)local_b0,local_d0,local_c8);
  local_210 = AmountFromValue((UniValue *)local_b0,8);
  local_218 = 100000000;
  local_108[0].p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_210 == 100000000);
  local_108[0].m_message.px = (element_type *)0x0;
  local_108[0].m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_118 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_110 = "";
  local_120 = &local_210;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae428;
  sStack_48.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_40 = &local_120;
  local_148 = &local_218;
  local_138 = 0;
  local_140 = &PTR__lazy_ostream_013ae958;
  local_130 = boost::unit_test::lazy_ostream::inst;
  local_128 = &local_148;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (local_108,&local_208,1,2,REQUIRE,0xec824d,(size_t)&local_118,0x121,local_58,
             "100000000LL",&local_140);
  boost::detail::shared_count::~shared_count(&local_108[0].m_message.pn);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(uStack_a7,local_a8) != &local_98) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(uStack_a7,local_a8),(ulong)(local_98._M_allocated_capacity + 1));
  }
  if (local_d0 != (rpc_tests *)local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  local_308 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_300 = "";
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  local_310 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x122;
  file_09.m_begin = (iterator)&local_308;
  msg_09.m_end = pvVar2;
  msg_09.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_318,
             msg_09);
  local_208.m_empty = false;
  local_208._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_1f8 = boost::unit_test::lazy_ostream::inst;
  local_1f0 = "";
  local_d0 = (rpc_tests *)local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"20999999.9999999","");
  ValueFromString((UniValue *)local_b0,local_d0,local_c8);
  local_210 = AmountFromValue((UniValue *)local_b0,8);
  local_218 = 0x775f05a073ff6;
  local_108[0].p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_210 == 0x775f05a073ff6);
  local_108[0].m_message.px = (element_type *)0x0;
  local_108[0].m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_118 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_110 = "";
  local_120 = &local_210;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae428;
  sStack_48.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_40 = &local_120;
  local_148 = &local_218;
  local_138 = 0;
  local_140 = &PTR__lazy_ostream_013ae958;
  local_130 = boost::unit_test::lazy_ostream::inst;
  local_128 = &local_148;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (local_108,&local_208,1,2,REQUIRE,0xec828d,(size_t)&local_118,0x122,local_58,
             "2099999999999990LL",&local_140);
  boost::detail::shared_count::~shared_count(&local_108[0].m_message.pn);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(uStack_a7,local_a8) != &local_98) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(uStack_a7,local_a8),(ulong)(local_98._M_allocated_capacity + 1));
  }
  if (local_d0 != (rpc_tests *)local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  local_328 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_320 = "";
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x123;
  file_10.m_begin = (iterator)&local_328;
  msg_10.m_end = pvVar2;
  msg_10.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_338,
             msg_10);
  local_208.m_empty = false;
  local_208._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_1f8 = boost::unit_test::lazy_ostream::inst;
  local_1f0 = "";
  local_d0 = (rpc_tests *)local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"20999999.99999999","");
  ValueFromString((UniValue *)local_b0,local_d0,local_c8);
  local_210 = AmountFromValue((UniValue *)local_b0,8);
  local_218 = 2099999999999999;
  local_108[0].p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_210 == 2099999999999999);
  local_108[0].m_message.px = (element_type *)0x0;
  local_108[0].m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_118 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_110 = "";
  local_120 = &local_210;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae428;
  sStack_48.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_40 = &local_120;
  local_148 = &local_218;
  local_138 = 0;
  local_140 = &PTR__lazy_ostream_013ae958;
  local_130 = boost::unit_test::lazy_ostream::inst;
  local_128 = &local_148;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (local_108,&local_208,1,2,REQUIRE,0xec82d5,(size_t)&local_118,0x123,local_58,
             "2099999999999999LL",&local_140);
  boost::detail::shared_count::~shared_count(&local_108[0].m_message.pn);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(uStack_a7,local_a8) != &local_98) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(uStack_a7,local_a8),(ulong)(local_98._M_allocated_capacity + 1));
  }
  if (local_d0 != (rpc_tests *)local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  local_348 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_340 = "";
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x125;
  file_11.m_begin = (iterator)&local_348;
  msg_11.m_end = pvVar2;
  msg_11.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_358,
             msg_11);
  local_208.m_empty = false;
  local_208._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_1f8 = boost::unit_test::lazy_ostream::inst;
  local_1f0 = "";
  local_d0 = (rpc_tests *)local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"1e-8","");
  ValueFromString((UniValue *)local_b0,local_d0,local_c8);
  local_210 = AmountFromValue((UniValue *)local_b0,8);
  local_218 = 1;
  local_108[0].p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_210 == 1);
  local_108[0].m_message.px = (element_type *)0x0;
  local_108[0].m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_118 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_110 = "";
  local_120 = &local_210;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae428;
  sStack_48.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_40 = &local_120;
  local_148 = &local_218;
  local_138 = 0;
  local_140 = &PTR__lazy_ostream_013ae428;
  local_130 = boost::unit_test::lazy_ostream::inst;
  local_128 = &local_148;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (local_108,&local_208,1,2,REQUIRE,0xec8323,(size_t)&local_118,0x125,local_58,
             "COIN/100000000",&local_140);
  boost::detail::shared_count::~shared_count(&local_108[0].m_message.pn);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(uStack_a7,local_a8) != &local_98) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(uStack_a7,local_a8),(ulong)(local_98._M_allocated_capacity + 1));
  }
  if (local_d0 != (rpc_tests *)local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  local_368 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_360 = "";
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  local_370 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x126;
  file_12.m_begin = (iterator)&local_368;
  msg_12.m_end = pvVar2;
  msg_12.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_378,
             msg_12);
  local_208.m_empty = false;
  local_208._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_1f8 = boost::unit_test::lazy_ostream::inst;
  local_1f0 = "";
  local_d0 = (rpc_tests *)local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"0.1e-7","");
  ValueFromString((UniValue *)local_b0,local_d0,local_c8);
  local_210 = AmountFromValue((UniValue *)local_b0,8);
  local_218 = 1;
  local_108[0].p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_210 == 1);
  local_108[0].m_message.px = (element_type *)0x0;
  local_108[0].m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_118 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_110 = "";
  local_120 = &local_210;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae428;
  sStack_48.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_40 = &local_120;
  local_148 = &local_218;
  local_138 = 0;
  local_140 = &PTR__lazy_ostream_013ae428;
  local_130 = boost::unit_test::lazy_ostream::inst;
  local_128 = &local_148;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (local_108,&local_208,1,2,REQUIRE,0xec8362,(size_t)&local_118,0x126,local_58,
             "COIN/100000000",&local_140);
  boost::detail::shared_count::~shared_count(&local_108[0].m_message.pn);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(uStack_a7,local_a8) != &local_98) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(uStack_a7,local_a8),(ulong)(local_98._M_allocated_capacity + 1));
  }
  if (local_d0 != (rpc_tests *)local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  local_388 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_380 = "";
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x127;
  file_13.m_begin = (iterator)&local_388;
  msg_13.m_end = pvVar2;
  msg_13.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_398,
             msg_13);
  local_208.m_empty = false;
  local_208._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_1f8 = boost::unit_test::lazy_ostream::inst;
  local_1f0 = "";
  local_d0 = (rpc_tests *)local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"0.01e-6","");
  ValueFromString((UniValue *)local_b0,local_d0,local_c8);
  local_210 = AmountFromValue((UniValue *)local_b0,8);
  local_218 = 1;
  local_108[0].p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_210 == 1);
  local_108[0].m_message.px = (element_type *)0x0;
  local_108[0].m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_118 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_110 = "";
  local_120 = &local_210;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae428;
  sStack_48.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_40 = &local_120;
  local_148 = &local_218;
  local_138 = 0;
  local_140 = &PTR__lazy_ostream_013ae428;
  local_130 = boost::unit_test::lazy_ostream::inst;
  local_128 = &local_148;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (local_108,&local_208,1,2,REQUIRE,0xec8395,(size_t)&local_118,0x127,local_58,
             "COIN/100000000",&local_140);
  boost::detail::shared_count::~shared_count(&local_108[0].m_message.pn);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(uStack_a7,local_a8) != &local_98) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(uStack_a7,local_a8),(ulong)(local_98._M_allocated_capacity + 1));
  }
  if (local_d0 != (rpc_tests *)local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  local_3a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_3a0 = "";
  local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0x128;
  file_14.m_begin = (iterator)&local_3a8;
  msg_14.m_end = pvVar2;
  msg_14.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_3b8,
             msg_14);
  local_208.m_empty = false;
  local_208._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_1f8 = boost::unit_test::lazy_ostream::inst;
  local_1f0 = "";
  local_d0 = (rpc_tests *)local_c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,"0.00000000000000000000000000000000000001e+30","");
  ValueFromString((UniValue *)local_b0,local_d0,local_c8);
  local_210 = AmountFromValue((UniValue *)local_b0,8);
  local_218 = CONCAT44(local_218._4_4_,1);
  local_108[0].p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_210 == 1);
  local_108[0].m_message.px = (element_type *)0x0;
  local_108[0].m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_118 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_110 = "";
  local_120 = &local_210;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae428;
  sStack_48.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_40 = &local_120;
  local_148 = &local_218;
  local_138 = 0;
  local_140 = &PTR__lazy_ostream_013ae248;
  local_130 = boost::unit_test::lazy_ostream::inst;
  local_128 = &local_148;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (local_108,&local_208,1,2,REQUIRE,0xec83ee,(size_t)&local_118,0x128,local_58,"1",
             &local_140);
  boost::detail::shared_count::~shared_count(&local_108[0].m_message.pn);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(uStack_a7,local_a8) != &local_98) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(uStack_a7,local_a8),(ulong)(local_98._M_allocated_capacity + 1));
  }
  if (local_d0 != (rpc_tests *)local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  local_3c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_3c0 = "";
  local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0x129;
  file_15.m_begin = (iterator)&local_3c8;
  msg_15.m_end = pvVar2;
  msg_15.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_3d8,
             msg_15);
  local_208.m_empty = false;
  local_208._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_1f8 = boost::unit_test::lazy_ostream::inst;
  local_1f0 = "";
  local_d0 = (rpc_tests *)local_c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,
             "0.0000000000000000000000000000000000000000000000000000000000000000000000000001e+68",""
            );
  ValueFromString((UniValue *)local_b0,local_d0,local_c8);
  local_210 = AmountFromValue((UniValue *)local_b0,8);
  local_218 = 1;
  local_108[0].p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_210 == 1);
  local_108[0].m_message.px = (element_type *)0x0;
  local_108[0].m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_118 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_110 = "";
  local_120 = &local_210;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae428;
  sStack_48.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_40 = &local_120;
  local_148 = &local_218;
  local_138 = 0;
  local_140 = &PTR__lazy_ostream_013ae428;
  local_130 = boost::unit_test::lazy_ostream::inst;
  local_128 = &local_148;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (local_108,&local_208,1,2,REQUIRE,0xec8492,(size_t)&local_118,0x129,local_58,
             "COIN/100000000",&local_140);
  boost::detail::shared_count::~shared_count(&local_108[0].m_message.pn);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(uStack_a7,local_a8) != &local_98) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(uStack_a7,local_a8),(ulong)(local_98._M_allocated_capacity + 1));
  }
  if (local_d0 != (rpc_tests *)local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  local_3e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_3e0 = "";
  local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0x12a;
  file_16.m_begin = (iterator)&local_3e8;
  msg_16.m_end = pvVar2;
  msg_16.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_3f8,
             msg_16);
  local_208.m_empty = false;
  local_208._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_1f8 = boost::unit_test::lazy_ostream::inst;
  local_1f0 = "";
  local_d0 = (rpc_tests *)local_c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,
             "10000000000000000000000000000000000000000000000000000000000000000e-64","");
  ValueFromString((UniValue *)local_b0,local_d0,local_c8);
  local_210 = AmountFromValue((UniValue *)local_b0,8);
  local_108[0].p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_210 == 100000000);
  local_108[0].m_message.px = (element_type *)0x0;
  local_108[0].m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_118 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_110 = "";
  local_120 = &local_210;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae428;
  sStack_48.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_40 = &local_120;
  local_148 = &COIN;
  local_138 = 0;
  local_140 = &PTR__lazy_ostream_013ae428;
  local_130 = boost::unit_test::lazy_ostream::inst;
  local_128 = &local_148;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (local_108,&local_208,1,2,REQUIRE,0xec854f,(size_t)&local_118,0x12a,local_58,"COIN",
             &local_140);
  boost::detail::shared_count::~shared_count(&local_108[0].m_message.pn);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(uStack_a7,local_a8) != &local_98) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(uStack_a7,local_a8),(ulong)(local_98._M_allocated_capacity + 1));
  }
  if (local_d0 != (rpc_tests *)local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  local_408 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_400 = "";
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0x12b;
  file_17.m_begin = (iterator)&local_408;
  msg_17.m_end = pvVar2;
  msg_17.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_418,
             msg_17);
  local_208.m_empty = false;
  local_208._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_1f8 = boost::unit_test::lazy_ostream::inst;
  local_1f0 = "";
  local_d0 = (rpc_tests *)local_c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,
             "0.000000000000000000000000000000000000000000000000000000000000000100000000000000000000000000000000000000000000000000000e64"
             ,"");
  ValueFromString((UniValue *)local_b0,local_d0,local_c8);
  local_210 = AmountFromValue((UniValue *)local_b0,8);
  local_108[0].p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_210 == 100000000);
  local_108[0].m_message.px = (element_type *)0x0;
  local_108[0].m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_118 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_110 = "";
  local_120 = &local_210;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae428;
  sStack_48.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_40 = &local_120;
  local_148 = &COIN;
  local_138 = 0;
  local_140 = &PTR__lazy_ostream_013ae428;
  local_130 = boost::unit_test::lazy_ostream::inst;
  local_128 = &local_148;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (local_108,&local_208,1,2,REQUIRE,0xec8634,(size_t)&local_118,299,local_58,"COIN",
             &local_140);
  boost::detail::shared_count::~shared_count(&local_108[0].m_message.pn);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(uStack_a7,local_a8) != &local_98) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(uStack_a7,local_a8),(ulong)(local_98._M_allocated_capacity + 1));
  }
  if (local_d0 != (rpc_tests *)local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  local_428 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_420 = "";
  local_438 = &boost::unit_test::basic_cstring<char_const>::null;
  local_430 = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0x12d;
  file_18.m_begin = (iterator)&local_428;
  msg_18.m_end = pvVar2;
  msg_18.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_438,
             msg_18);
  local_58._0_8_ = (rpc_tests *)&sStack_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"1e-9","");
  ValueFromString((UniValue *)local_b0,(rpc_tests *)local_58._0_8_,(string *)local_58._8_8_);
  AmountFromValue((UniValue *)local_b0,8);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(uStack_a7,local_a8) != &local_98) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(uStack_a7,local_a8),(ulong)(local_98._M_allocated_capacity + 1));
  }
  if ((rpc_tests *)local_58._0_8_ != (rpc_tests *)&sStack_48) {
    operator_delete((void *)local_58._0_8_,
                    (ulong)((long)&(sStack_48.pi_)->_vptr_sp_counted_base + 1));
  }
  local_448 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_440 = "";
  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar3 = 0x567186;
  file_19.m_end = (iterator)0x12d;
  file_19.m_begin = (iterator)&local_448;
  msg_19.m_end = pvVar2;
  msg_19.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_458,
             msg_19);
  local_58._0_8_ = local_58._0_8_ & 0xffffffffffffff00;
  local_58._8_8_ = (element_type *)0x0;
  sStack_48.pi_ = (sp_counted_base *)0x0;
  local_a8 = false;
  local_b0 = (undefined1  [8])&PTR__lazy_ostream_013af210;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_98._M_allocated_capacity = 0xec5be1;
  local_468 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_460 = "";
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)local_b0,1,1,WARN,_cVar3,
             (size_t)&local_468,0x12d);
  boost::detail::shared_count::~shared_count(&sStack_48);
  local_4a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_4a0 = "";
  local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_20.m_end = (iterator)0x12e;
  file_20.m_begin = (iterator)&local_4a8;
  msg_20.m_end = pvVar2;
  msg_20.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_4b8,
             msg_20);
  local_58._0_8_ = (rpc_tests *)&sStack_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"0.000000019","");
  ValueFromString((UniValue *)local_b0,(rpc_tests *)local_58._0_8_,(string *)local_58._8_8_);
  AmountFromValue((UniValue *)local_b0,8);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(uStack_a7,local_a8) != &local_98) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(uStack_a7,local_a8),(ulong)(local_98._M_allocated_capacity + 1));
  }
  if ((rpc_tests *)local_58._0_8_ != (rpc_tests *)&sStack_48) {
    operator_delete((void *)local_58._0_8_,
                    (ulong)((long)&(sStack_48.pi_)->_vptr_sp_counted_base + 1));
  }
  local_4c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_4c0 = "";
  local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4d0 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar3 = 0x567310;
  file_21.m_end = (iterator)0x12e;
  file_21.m_begin = (iterator)&local_4c8;
  msg_21.m_end = pvVar2;
  msg_21.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_4d8,
             msg_21);
  local_58._0_8_ = local_58._0_8_ & 0xffffffffffffff00;
  local_58._8_8_ = (element_type *)0x0;
  sStack_48.pi_ = (sp_counted_base *)0x0;
  local_a8 = false;
  local_b0 = (undefined1  [8])&PTR__lazy_ostream_013af210;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_98._M_allocated_capacity = 0xec5be1;
  local_4e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_4e0 = "";
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)local_b0,1,1,WARN,_cVar3,
             (size_t)&local_4e8,0x12e);
  boost::detail::shared_count::~shared_count(&sStack_48);
  local_528 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_520 = "";
  local_538 = &boost::unit_test::basic_cstring<char_const>::null;
  local_530 = &boost::unit_test::basic_cstring<char_const>::null;
  file_22.m_end = (iterator)0x12f;
  file_22.m_begin = (iterator)&local_528;
  msg_22.m_end = pvVar2;
  msg_22.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_538,
             msg_22);
  local_208.m_empty = false;
  local_208._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_1f8 = boost::unit_test::lazy_ostream::inst;
  local_1f0 = "";
  local_d0 = (rpc_tests *)local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"0.00000001000000","");
  ValueFromString((UniValue *)local_b0,local_d0,local_c8);
  local_210 = AmountFromValue((UniValue *)local_b0,8);
  local_218 = 1;
  local_108[0].p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_210 == 1);
  local_108[0].m_message.px = (element_type *)0x0;
  local_108[0].m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_118 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_110 = "";
  local_120 = &local_210;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae428;
  sStack_48.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_40 = &local_120;
  local_148 = &local_218;
  local_138 = 0;
  local_140 = &PTR__lazy_ostream_013ae958;
  local_130 = boost::unit_test::lazy_ostream::inst;
  local_128 = &local_148;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (local_108,&local_208,1,2,REQUIRE,0xec86f5,(size_t)&local_118,0x12f,local_58,"1LL",
             &local_140);
  boost::detail::shared_count::~shared_count(&local_108[0].m_message.pn);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(uStack_a7,local_a8) != &local_98) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(uStack_a7,local_a8),(ulong)(local_98._M_allocated_capacity + 1));
  }
  if (local_d0 != (rpc_tests *)local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  local_548 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_540 = "";
  local_558 = &boost::unit_test::basic_cstring<char_const>::null;
  local_550 = &boost::unit_test::basic_cstring<char_const>::null;
  file_23.m_end = (iterator)0x130;
  file_23.m_begin = (iterator)&local_548;
  msg_23.m_end = pvVar2;
  msg_23.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_558,
             msg_23);
  local_58._0_8_ = (rpc_tests *)&sStack_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"19e-9","");
  ValueFromString((UniValue *)local_b0,(rpc_tests *)local_58._0_8_,(string *)local_58._8_8_);
  AmountFromValue((UniValue *)local_b0,8);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(uStack_a7,local_a8) != &local_98) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(uStack_a7,local_a8),(ulong)(local_98._M_allocated_capacity + 1));
  }
  if ((rpc_tests *)local_58._0_8_ != (rpc_tests *)&sStack_48) {
    operator_delete((void *)local_58._0_8_,
                    (ulong)((long)&(sStack_48.pi_)->_vptr_sp_counted_base + 1));
  }
  local_568 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_560 = "";
  local_578 = &boost::unit_test::basic_cstring<char_const>::null;
  local_570 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar3 = 0x5676b1;
  file_24.m_end = (iterator)0x130;
  file_24.m_begin = (iterator)&local_568;
  msg_24.m_end = pvVar2;
  msg_24.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_578,
             msg_24);
  local_58._0_8_ = local_58._0_8_ & 0xffffffffffffff00;
  local_58._8_8_ = (element_type *)0x0;
  sStack_48.pi_ = (sp_counted_base *)0x0;
  local_a8 = false;
  local_b0 = (undefined1  [8])&PTR__lazy_ostream_013af210;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_98._M_allocated_capacity = 0xec5be1;
  local_588 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_580 = "";
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)local_b0,1,1,WARN,_cVar3,
             (size_t)&local_588,0x130);
  boost::detail::shared_count::~shared_count(&sStack_48);
  local_5c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_5c0 = "";
  local_5d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_25.m_end = (iterator)0x131;
  file_25.m_begin = (iterator)&local_5c8;
  msg_25.m_end = pvVar2;
  msg_25.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_5d8,
             msg_25);
  local_208.m_empty = false;
  local_208._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_1f8 = boost::unit_test::lazy_ostream::inst;
  local_1f0 = "";
  local_d0 = (rpc_tests *)local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"0.19e-6","");
  ValueFromString((UniValue *)local_b0,local_d0,local_c8);
  local_210 = AmountFromValue((UniValue *)local_b0,8);
  local_218 = CONCAT44(local_218._4_4_,0x13);
  local_108[0].p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_210 == 0x13);
  local_108[0].m_message.px = (element_type *)0x0;
  local_108[0].m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_118 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_110 = "";
  local_120 = &local_210;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae428;
  sStack_48.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_40 = &local_120;
  local_148 = &local_218;
  local_138 = 0;
  local_140 = &PTR__lazy_ostream_013ae248;
  local_130 = boost::unit_test::lazy_ostream::inst;
  local_128 = &local_148;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (local_108,&local_208,1,2,REQUIRE,0xec8738,(size_t)&local_118,0x131,local_58,"19",
             &local_140);
  boost::detail::shared_count::~shared_count(&local_108[0].m_message.pn);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(uStack_a7,local_a8) != &local_98) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(uStack_a7,local_a8),(ulong)(local_98._M_allocated_capacity + 1));
  }
  if (local_d0 != (rpc_tests *)local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  local_5e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_5e0 = "";
  local_5f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_26.m_end = (iterator)0x132;
  file_26.m_begin = (iterator)&local_5e8;
  msg_26.m_end = pvVar2;
  msg_26.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)&local_5f8,
             msg_26);
  ::UniValue::UniValue<const_char_(&)[7],_char[7],_true>
            ((UniValue *)local_b0,(char (*) [7])0xec8731);
  AmountFromValue((UniValue *)local_b0,8);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(uStack_a7,local_a8) != &local_98) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(uStack_a7,local_a8),(ulong)(local_98._M_allocated_capacity + 1));
  }
  local_608 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_600 = "";
  local_618 = &boost::unit_test::basic_cstring<char_const>::null;
  local_610 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar3 = 0x567a00;
  file_27.m_end = (iterator)0x132;
  file_27.m_begin = (iterator)&local_608;
  msg_27.m_end = pvVar2;
  msg_27.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,(size_t)&local_618,
             msg_27);
  local_58._0_8_ = local_58._0_8_ & 0xffffffffffffff00;
  local_58._8_8_ = (element_type *)0x0;
  sStack_48.pi_ = (sp_counted_base *)0x0;
  local_a8 = false;
  local_b0 = (undefined1  [8])&PTR__lazy_ostream_013af210;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_98._M_allocated_capacity = 0xec5be1;
  local_628 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_620 = "";
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)local_b0,1,1,WARN,_cVar3,
             (size_t)&local_628,0x132);
  boost::detail::shared_count::~shared_count(&sStack_48);
  local_668 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_660 = "";
  local_678 = &boost::unit_test::basic_cstring<char_const>::null;
  local_670 = &boost::unit_test::basic_cstring<char_const>::null;
  file_28.m_end = (iterator)0x134;
  file_28.m_begin = (iterator)&local_668;
  msg_28.m_end = pvVar2;
  msg_28.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,(size_t)&local_678,
             msg_28);
  local_58._0_8_ = (rpc_tests *)&sStack_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"92233720368.54775808","");
  ValueFromString((UniValue *)local_b0,(rpc_tests *)local_58._0_8_,(string *)local_58._8_8_);
  AmountFromValue((UniValue *)local_b0,8);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(uStack_a7,local_a8) != &local_98) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(uStack_a7,local_a8),(ulong)(local_98._M_allocated_capacity + 1));
  }
  if ((rpc_tests *)local_58._0_8_ != (rpc_tests *)&sStack_48) {
    operator_delete((void *)local_58._0_8_,
                    (ulong)((long)&(sStack_48.pi_)->_vptr_sp_counted_base + 1));
  }
  local_688 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_680 = "";
  local_698 = &boost::unit_test::basic_cstring<char_const>::null;
  local_690 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar3 = 0x567b82;
  file_29.m_end = (iterator)0x134;
  file_29.m_begin = (iterator)&local_688;
  msg_29.m_end = pvVar2;
  msg_29.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,(size_t)&local_698,
             msg_29);
  local_58._0_8_ = local_58._0_8_ & 0xffffffffffffff00;
  local_58._8_8_ = (element_type *)0x0;
  sStack_48.pi_ = (sp_counted_base *)0x0;
  local_a8 = false;
  local_b0 = (undefined1  [8])&PTR__lazy_ostream_013af210;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_98._M_allocated_capacity = 0xec5be1;
  local_6a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_6a0 = "";
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)local_b0,1,1,WARN,_cVar3,
             (size_t)&local_6a8,0x134);
  boost::detail::shared_count::~shared_count(&sStack_48);
  local_6e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_6e0 = "";
  local_6f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_30.m_end = (iterator)0x135;
  file_30.m_begin = (iterator)&local_6e8;
  msg_30.m_end = pvVar2;
  msg_30.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,(size_t)&local_6f8,
             msg_30);
  local_58._0_8_ = (rpc_tests *)&sStack_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"1e+11","");
  ValueFromString((UniValue *)local_b0,(rpc_tests *)local_58._0_8_,(string *)local_58._8_8_);
  AmountFromValue((UniValue *)local_b0,8);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(uStack_a7,local_a8) != &local_98) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(uStack_a7,local_a8),(ulong)(local_98._M_allocated_capacity + 1));
  }
  if ((rpc_tests *)local_58._0_8_ != (rpc_tests *)&sStack_48) {
    operator_delete((void *)local_58._0_8_,
                    (ulong)((long)&(sStack_48.pi_)->_vptr_sp_counted_base + 1));
  }
  local_708 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_700 = "";
  local_718 = &boost::unit_test::basic_cstring<char_const>::null;
  local_710 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar3 = 0x567d04;
  file_31.m_end = (iterator)0x135;
  file_31.m_begin = (iterator)&local_708;
  msg_31.m_end = pvVar2;
  msg_31.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_31,(size_t)&local_718,
             msg_31);
  local_58._0_8_ = local_58._0_8_ & 0xffffffffffffff00;
  local_58._8_8_ = (element_type *)0x0;
  sStack_48.pi_ = (sp_counted_base *)0x0;
  local_a8 = false;
  local_b0 = (undefined1  [8])&PTR__lazy_ostream_013af210;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_98._M_allocated_capacity = 0xec5be1;
  local_728 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_720 = "";
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)local_b0,1,1,WARN,_cVar3,
             (size_t)&local_728,0x135);
  boost::detail::shared_count::~shared_count(&sStack_48);
  local_768 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_760 = "";
  local_778 = &boost::unit_test::basic_cstring<char_const>::null;
  local_770 = &boost::unit_test::basic_cstring<char_const>::null;
  file_32.m_end = (iterator)0x136;
  file_32.m_begin = (iterator)&local_768;
  msg_32.m_end = pvVar2;
  msg_32.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_32,(size_t)&local_778,
             msg_32);
  local_58._0_8_ = (rpc_tests *)&sStack_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"1e11","");
  ValueFromString((UniValue *)local_b0,(rpc_tests *)local_58._0_8_,(string *)local_58._8_8_);
  AmountFromValue((UniValue *)local_b0,8);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(uStack_a7,local_a8) != &local_98) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(uStack_a7,local_a8),(ulong)(local_98._M_allocated_capacity + 1));
  }
  if ((rpc_tests *)local_58._0_8_ != (rpc_tests *)&sStack_48) {
    operator_delete((void *)local_58._0_8_,
                    (ulong)((long)&(sStack_48.pi_)->_vptr_sp_counted_base + 1));
  }
  local_788 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_780 = "";
  local_798 = &boost::unit_test::basic_cstring<char_const>::null;
  local_790 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar3 = 0x567e86;
  file_33.m_end = (iterator)0x136;
  file_33.m_begin = (iterator)&local_788;
  msg_33.m_end = pvVar2;
  msg_33.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_33,(size_t)&local_798,
             msg_33);
  local_58._0_8_ = local_58._0_8_ & 0xffffffffffffff00;
  local_58._8_8_ = (element_type *)0x0;
  sStack_48.pi_ = (sp_counted_base *)0x0;
  local_a8 = false;
  local_b0 = (undefined1  [8])&PTR__lazy_ostream_013af210;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_98._M_allocated_capacity = 0xec5be1;
  local_7a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_7a0 = "";
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)local_b0,1,1,WARN,_cVar3,
             (size_t)&local_7a8,0x136);
  boost::detail::shared_count::~shared_count(&sStack_48);
  local_7e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_7e0 = "";
  local_7f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_34.m_end = (iterator)0x137;
  file_34.m_begin = (iterator)&local_7e8;
  msg_34.m_end = pvVar2;
  msg_34.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_34,(size_t)&local_7f8,
             msg_34);
  local_58._0_8_ = (rpc_tests *)&sStack_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"93e+9","");
  ValueFromString((UniValue *)local_b0,(rpc_tests *)local_58._0_8_,(string *)local_58._8_8_);
  AmountFromValue((UniValue *)local_b0,8);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(uStack_a7,local_a8) != &local_98) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(uStack_a7,local_a8),(ulong)(local_98._M_allocated_capacity + 1));
  }
  if ((rpc_tests *)local_58._0_8_ != (rpc_tests *)&sStack_48) {
    operator_delete((void *)local_58._0_8_,
                    (ulong)((long)&(sStack_48.pi_)->_vptr_sp_counted_base + 1));
  }
  local_808 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_800 = "";
  local_818 = &boost::unit_test::basic_cstring<char_const>::null;
  local_810 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar3 = 0x568006;
  file_35.m_end = (iterator)0x137;
  file_35.m_begin = (iterator)&local_808;
  msg_35.m_end = pvVar2;
  msg_35.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_35,(size_t)&local_818,
             msg_35);
  local_58._0_8_ = local_58._0_8_ & 0xffffffffffffff00;
  local_58._8_8_ = (element_type *)0x0;
  sStack_48.pi_ = (sp_counted_base *)0x0;
  local_a8 = false;
  local_b0 = (undefined1  [8])&PTR__lazy_ostream_013af210;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_98._M_allocated_capacity = 0xec5be1;
  local_828 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_820 = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)local_b0,1,1,WARN,_cVar3,
             (size_t)&local_828,0x137);
  boost::detail::shared_count::~shared_count(&sStack_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(rpc_parse_monetary_values)
{
    BOOST_CHECK_THROW(AmountFromValue(ValueFromString("-0.00000001")), UniValue);
    BOOST_CHECK_EQUAL(AmountFromValue(ValueFromString("0")), 0LL);
    BOOST_CHECK_EQUAL(AmountFromValue(ValueFromString("0.00000000")), 0LL);
    BOOST_CHECK_EQUAL(AmountFromValue(ValueFromString("0.00000001")), 1LL);
    BOOST_CHECK_EQUAL(AmountFromValue(ValueFromString("0.17622195")), 17622195LL);
    BOOST_CHECK_EQUAL(AmountFromValue(ValueFromString("0.5")), 50000000LL);
    BOOST_CHECK_EQUAL(AmountFromValue(ValueFromString("0.50000000")), 50000000LL);
    BOOST_CHECK_EQUAL(AmountFromValue(ValueFromString("0.89898989")), 89898989LL);
    BOOST_CHECK_EQUAL(AmountFromValue(ValueFromString("1.00000000")), 100000000LL);
    BOOST_CHECK_EQUAL(AmountFromValue(ValueFromString("20999999.9999999")), 2099999999999990LL);
    BOOST_CHECK_EQUAL(AmountFromValue(ValueFromString("20999999.99999999")), 2099999999999999LL);

    BOOST_CHECK_EQUAL(AmountFromValue(ValueFromString("1e-8")), COIN/100000000);
    BOOST_CHECK_EQUAL(AmountFromValue(ValueFromString("0.1e-7")), COIN/100000000);
    BOOST_CHECK_EQUAL(AmountFromValue(ValueFromString("0.01e-6")), COIN/100000000);
    BOOST_CHECK_EQUAL(AmountFromValue(ValueFromString("0.00000000000000000000000000000000000001e+30")), 1);
    BOOST_CHECK_EQUAL(AmountFromValue(ValueFromString("0.0000000000000000000000000000000000000000000000000000000000000000000000000001e+68")), COIN/100000000);
    BOOST_CHECK_EQUAL(AmountFromValue(ValueFromString("10000000000000000000000000000000000000000000000000000000000000000e-64")), COIN);
    BOOST_CHECK_EQUAL(AmountFromValue(ValueFromString("0.000000000000000000000000000000000000000000000000000000000000000100000000000000000000000000000000000000000000000000000e64")), COIN);

    BOOST_CHECK_THROW(AmountFromValue(ValueFromString("1e-9")), UniValue); //should fail
    BOOST_CHECK_THROW(AmountFromValue(ValueFromString("0.000000019")), UniValue); //should fail
    BOOST_CHECK_EQUAL(AmountFromValue(ValueFromString("0.00000001000000")), 1LL); //should pass, cut trailing 0
    BOOST_CHECK_THROW(AmountFromValue(ValueFromString("19e-9")), UniValue); //should fail
    BOOST_CHECK_EQUAL(AmountFromValue(ValueFromString("0.19e-6")), 19); //should pass, leading 0 is present
    BOOST_CHECK_EXCEPTION(AmountFromValue(".19e-6"), UniValue, HasJSON(R"({"code":-3,"message":"Invalid amount"})")); //should fail, no leading 0

    BOOST_CHECK_THROW(AmountFromValue(ValueFromString("92233720368.54775808")), UniValue); //overflow error
    BOOST_CHECK_THROW(AmountFromValue(ValueFromString("1e+11")), UniValue); //overflow error
    BOOST_CHECK_THROW(AmountFromValue(ValueFromString("1e11")), UniValue); //overflow error signless
    BOOST_CHECK_THROW(AmountFromValue(ValueFromString("93e+9")), UniValue); //overflow error
}